

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall tcu::operator*(tcu *this,Matrix<float,_2,_2> *mtx,float scalar)

{
  int col;
  long lVar1;
  int row;
  long lVar2;
  float fVar3;
  ulong extraout_XMM0_Qa;
  Matrix<float,_2,_2> MVar5;
  ulong uVar4;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      fVar3 = ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)mtx)->m_data)->m_data[0].
              m_data[lVar2] * scalar;
      uVar4 = (ulong)(uint)fVar3;
      *(float *)(this + lVar2 * 4) = fVar3;
    }
    this = this + 8;
    mtx = (Matrix<float,_2,_2> *)((long)mtx + 8);
  }
  MVar5.m_data.m_data[1].m_data[0] = scalar;
  MVar5.m_data.m_data[0].m_data[0] = (float)(int)uVar4;
  MVar5.m_data.m_data[0].m_data[1] = (float)(int)(uVar4 >> 0x20);
  MVar5.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar5.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}